

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O2

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  int i;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  void *pvVar23;
  uint uVar24;
  int q_8;
  int i_2;
  int q;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 in_XMM7 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [12];
  float fVar33;
  float fVar34;
  
  iVar1 = bottom_top_blob->dims;
  uVar2 = this->group;
  uVar10 = (long)this->channels / (long)(int)uVar2;
  iVar7 = (int)uVar10;
  lVar8 = (long)iVar7;
  if (iVar1 == 2) {
    uVar24 = bottom_top_blob->w;
    pvVar9 = bottom_top_blob->data;
    pvVar11 = (this->gamma_data).data;
    sVar4 = (this->gamma_data).elemsize;
    pvVar23 = (this->beta_data).data;
    sVar5 = (this->beta_data).elemsize;
    uVar20 = 0;
    uVar17 = 0;
    if (0 < (int)uVar24) {
      uVar17 = (ulong)uVar24;
    }
    uVar22 = 0;
    if (0 < iVar7) {
      uVar22 = uVar10 & 0xffffffff;
    }
    uVar25 = 0;
    if (0 < (int)uVar2) {
      uVar25 = (ulong)uVar2;
    }
    fVar28 = 1.0 / (float)(int)(uVar24 * iVar7);
    lVar16 = (long)(int)uVar24 * bottom_top_blob->elemsize;
    for (; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      fVar29 = 0.0;
      pvVar12 = pvVar9;
      for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          fVar29 = fVar29 + *(float *)((long)pvVar12 + uVar13 * 4);
        }
        pvVar12 = (void *)((long)pvVar12 + lVar16);
      }
      fVar29 = fVar29 * fVar28;
      fVar30 = 0.0;
      pvVar12 = pvVar9;
      for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          fVar33 = *(float *)((long)pvVar12 + uVar13 * 4) - fVar29;
          fVar30 = fVar30 + fVar33 * fVar33;
        }
        pvVar12 = (void *)((long)pvVar12 + lVar16);
      }
      fVar30 = fVar30 * fVar28;
      iVar3 = this->affine;
      pvVar12 = pvVar9;
      for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
        if (iVar3 == 0) {
          fVar34 = this->eps + fVar30;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar34));
          fVar33 = auVar31._0_4_;
          in_XMM7._4_12_ = auVar31._4_12_;
          in_XMM7._0_4_ = fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0);
          fVar33 = in_XMM7._0_4_ * -fVar29;
        }
        else {
          fVar34 = this->eps + fVar30;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar34));
          fVar33 = auVar31._0_4_;
          in_XMM7._4_12_ = auVar31._4_12_;
          in_XMM7._0_4_ =
               fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0) *
               *(float *)((long)pvVar11 + uVar18 * 4 + sVar4 * uVar20 * lVar8);
          fVar33 = *(float *)((long)pvVar23 + uVar18 * 4 + uVar20 * lVar8 * sVar5) -
                   in_XMM7._0_4_ * fVar29;
        }
        for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)((long)pvVar12 + uVar13 * 4) =
               *(float *)((long)pvVar12 + uVar13 * 4) * in_XMM7._0_4_ + fVar33;
        }
        pvVar12 = (void *)((long)pvVar12 + lVar16);
      }
      pvVar9 = (void *)((long)pvVar9 + lVar16 * lVar8);
    }
  }
  else if (iVar1 == 1) {
    pvVar9 = bottom_top_blob->data;
    pvVar11 = (this->gamma_data).data;
    uVar17 = 0;
    uVar20 = 0;
    if (0 < iVar7) {
      uVar20 = uVar10 & 0xffffffff;
    }
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    pvVar23 = (this->beta_data).data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = (this->beta_data).elemsize;
    sVar6 = (this->gamma_data).elemsize;
    for (; uVar17 != uVar22; uVar17 = uVar17 + 1) {
      fVar28 = 0.0;
      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        fVar28 = fVar28 + *(float *)((long)pvVar9 + uVar25 * 4);
      }
      fVar28 = fVar28 * (1.0 / (float)iVar7);
      fVar29 = 0.0;
      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        fVar30 = *(float *)((long)pvVar9 + uVar25 * 4) - fVar28;
        fVar29 = fVar29 + fVar30 * fVar30;
      }
      fVar29 = fVar29 * (1.0 / (float)iVar7);
      iVar3 = this->affine;
      for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
        if (iVar3 == 0) {
          fVar33 = this->eps + fVar29;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar33));
          fVar30 = auVar31._0_4_;
          auVar32 = auVar31._4_12_;
          fVar30 = fVar30 * -0.5 * (fVar33 * fVar30 * fVar30 + -3.0);
          fVar33 = fVar30 * -fVar28;
        }
        else {
          fVar33 = this->eps + fVar29;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar33));
          fVar30 = auVar31._0_4_;
          auVar32 = auVar31._4_12_;
          fVar30 = fVar30 * -0.5 * (fVar33 * fVar30 * fVar30 + -3.0) *
                   *(float *)((long)pvVar11 + uVar25 * 4);
          fVar33 = *(float *)((long)pvVar23 + uVar25 * 4) - fVar30 * fVar28;
        }
        in_XMM7._0_4_ = fVar30 * *(float *)((long)pvVar9 + uVar25 * 4) + fVar33;
        in_XMM7._4_12_ = auVar32;
        *(float *)((long)pvVar9 + uVar25 * 4) = in_XMM7._0_4_;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar4 * lVar8);
      pvVar23 = (void *)((long)pvVar23 + sVar5 * lVar8);
      pvVar11 = (void *)((long)pvVar11 + sVar6 * lVar8);
    }
  }
  if (iVar1 - 3U < 2) {
    uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar9 = bottom_top_blob->data;
    uVar17 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    uVar25 = (long)bottom_top_blob->d * uVar17 * (long)bottom_top_blob->h * (long)bottom_top_blob->w
             + 0xf & 0xfffffffffffffff0;
    pvVar11 = (this->gamma_data).data;
    sVar5 = (this->gamma_data).elemsize;
    pvVar23 = (this->beta_data).data;
    uVar22 = 0;
    uVar20 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar20 = uVar22;
    }
    sVar6 = (this->beta_data).elemsize;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar7 < 1) {
      uVar10 = uVar22;
    }
    uVar18 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar18 = uVar22;
    }
    fVar28 = 1.0 / (float)(int)(uVar24 * iVar7);
    for (; uVar22 != uVar18; uVar22 = uVar22 + 1) {
      lVar16 = uVar22 * lVar8;
      lVar19 = sVar4 * uVar17 * lVar16;
      lVar21 = uVar25 - uVar25 % uVar17;
      fVar29 = 0.0;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        lVar14 = 0;
        uVar26 = uVar20;
        while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
          fVar29 = fVar29 + *(float *)((long)pvVar9 + lVar14 * 4 + lVar21 * uVar13 + lVar19);
          lVar14 = lVar14 + 1;
        }
      }
      fVar29 = fVar29 * fVar28;
      fVar30 = 0.0;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        lVar14 = 0;
        uVar26 = uVar20;
        while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
          fVar33 = *(float *)((long)pvVar9 + lVar14 * 4 + lVar21 * uVar13 + lVar19) - fVar29;
          fVar30 = fVar30 + fVar33 * fVar33;
          lVar14 = lVar14 + 1;
        }
      }
      fVar30 = fVar30 * fVar28;
      iVar1 = this->affine;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        if (iVar1 == 0) {
          fVar34 = this->eps + fVar30;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar34));
          fVar33 = auVar31._0_4_;
          in_XMM7._4_12_ = auVar31._4_12_;
          in_XMM7._0_4_ = fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0);
          fVar33 = in_XMM7._0_4_ * -fVar29;
        }
        else {
          fVar34 = this->eps + fVar30;
          auVar31 = rsqrtss(in_XMM7,ZEXT416((uint)fVar34));
          fVar33 = auVar31._0_4_;
          in_XMM7._4_12_ = auVar31._4_12_;
          in_XMM7._0_4_ =
               fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0) *
               *(float *)((long)pvVar11 + uVar13 * 4 + sVar5 * lVar16);
          fVar33 = *(float *)((long)pvVar23 + uVar13 * 4 + lVar16 * sVar6) - in_XMM7._0_4_ * fVar29;
        }
        lVar14 = lVar21 * uVar13 + lVar19;
        lVar15 = 0;
        uVar26 = uVar20;
        while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
          *(float *)((long)pvVar9 + lVar15 * 4 + lVar14) =
               *(float *)((long)pvVar9 + lVar15 * 4 + lVar14) * in_XMM7._0_4_ + fVar33;
          lVar15 = lVar15 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                sum += bottom_top_blob_g[q];
            }
            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                float tmp = bottom_top_blob_g[q] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / channels_per_group;

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                bottom_top_blob_g[q] = bottom_top_blob_g[q] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * w);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * w);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * size);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}